

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O0

void __thiscall Display::addUserSetting(Display *this,string *setting)

{
  size_type sVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *setting_local;
  Display *this_local;
  
  local_18 = setting;
  setting_local = &this->sFileBase;
  sVar1 = std::vector<Plot,_std::allocator<Plot>_>::size(&this->vPlots);
  if (sVar1 == 0) {
    std::operator+(&local_68,setting,"\n");
    std::__cxx11::string::operator+=((string *)&this->sUserSettings,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    std::operator+(&local_38,setting,"\n");
    pvVar2 = std::vector<Plot,_std::allocator<Plot>_>::back(&this->vPlots);
    std::__cxx11::string::operator+=((string *)&pvVar2->sUserSettings,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void Display::addUserSetting( string setting )
{
	if (vPlots.size())
		vPlots.back().sUserSettings += setting + "\n";
	else
		sUserSettings += setting + "\n";
}